

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O3

int Rnm_ManSensitize(Rnm_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Rnm_Obj_t RVar6;
  Gia_Obj_t *pGVar7;
  Rnm_Obj_t *pRVar8;
  Gia_Man_t *pGVar9;
  ulong uVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  Rnm_Obj_t RVar14;
  Vec_Int_t *pVVar15;
  ulong uVar16;
  long lVar17;
  Abc_Cex_t *pAVar18;
  uint uVar19;
  int iVar20;
  Rnm_Obj_t RVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  int local_40;
  
  pAVar18 = p->pCex;
  iVar12 = pAVar18->iFrame;
  local_40 = pAVar18->nRegs;
  if (-1 < iVar12) {
    iVar24 = 0;
    do {
      pVVar15 = p->vMap;
      if (0 < pVVar15->nSize) {
        lVar23 = 0;
        do {
          iVar12 = pVVar15->pArray[lVar23];
          if (((long)iVar12 < 0) || (p->pGia->nObjs <= iVar12)) goto LAB_00579b34;
          pGVar7 = p->pGia->pObjs;
          if (pGVar7 == (Gia_Obj_t *)0x0) break;
          pGVar7 = pGVar7 + iVar12;
          uVar22 = (uint)*(ulong *)pGVar7;
          if (((uVar22 & 0x9fffffff) != 0x9fffffff) &&
             (((int)uVar22 < 0 || ((uVar22 & 0x1fffffff) == 0x1fffffff)))) {
            __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                          ,0x196,"int Rnm_ManSensitize(Rnm_Man_t *)");
          }
          uVar22 = pGVar7->Value;
          if (uVar22 == 0 && (~*(ulong *)pGVar7 & 0x1fffffff1fffffff) != 0) goto LAB_00579b53;
          if (p->nObjsFrame <= (int)uVar22) goto LAB_00579b72;
          if (p->pCex->iFrame < iVar24) goto LAB_00579b91;
          iVar12 = p->nObjsFrame * iVar24;
          pRVar8 = p->pObjs;
          uVar19 = local_40 + (int)lVar23;
          RVar21 = pRVar8[(long)iVar12 + (ulong)uVar22];
          uVar19 = (uint)(((uint)(&p->pCex[1].iPo)[(int)uVar19 >> 5] >> (uVar19 & 0x1f) & 1) != 0);
          pRVar8[(long)iVar12 + (ulong)uVar22] = (Rnm_Obj_t)((uint)RVar21 & 0xfffffffe | uVar19);
          if ((((uint)*(ulong *)pGVar7 & 0x9fffffff) != 0x9fffffff) ||
             (p->pGia->vCis->nSize - p->pGia->nRegs <=
              (int)((uint)(*(ulong *)pGVar7 >> 0x20) & 0x1fffffff))) {
            if (pGVar7->Value == 0) {
              __assert_fail("pObj->Value > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                            ,0x19b,"int Rnm_ManSensitize(Rnm_Man_t *)");
            }
            pRVar8[(long)iVar12 + (ulong)uVar22] =
                 (Rnm_Obj_t)
                 ((pGVar7->Value & 0xffffff) * 0x10 + ((uint)RVar21 & 0xf0000006 | uVar19) + 8);
          }
          lVar23 = lVar23 + 1;
          pVVar15 = p->vMap;
        } while (lVar23 < pVVar15->nSize);
      }
      pVVar15 = p->vObjs;
      if (0 < pVVar15->nSize) {
        lVar23 = 0;
        do {
          iVar12 = pVVar15->pArray[lVar23];
          if ((long)iVar12 < 0) goto LAB_00579b34;
          pGVar9 = p->pGia;
          if (pGVar9->nObjs <= iVar12) goto LAB_00579b34;
          pGVar7 = pGVar9->pObjs;
          if (pGVar7 == (Gia_Obj_t *)0x0) break;
          pGVar1 = pGVar7 + iVar12;
          uVar10 = *(ulong *)pGVar1;
          uVar19 = (uint)uVar10;
          uVar22 = (uint)(uVar10 >> 0x20);
          if ((uVar19 & 0x9fffffff) == 0x9fffffff) {
            if ((int)(uVar22 & 0x1fffffff) < pGVar9->vCis->nSize - pGVar9->nRegs) {
LAB_00579bb0:
              __assert_fail("Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                            ,0x1a2,"int Rnm_ManSensitize(Rnm_Man_t *)");
            }
          }
          else if ((~uVar19 & 0x1fffffff) == 0) goto LAB_00579bb0;
          uVar2 = pGVar1->Value;
          if (uVar2 == 0 && (~uVar10 & 0x1fffffff1fffffff) != 0) goto LAB_00579b53;
          iVar12 = p->nObjsFrame;
          if (iVar12 <= (int)uVar2) goto LAB_00579b72;
          if (p->pCex->iFrame < iVar24) goto LAB_00579b91;
          pRVar8 = p->pObjs;
          iVar20 = iVar12 * iVar24;
          RVar21 = pRVar8[(long)iVar20 + (ulong)uVar2];
          if (((uint)RVar21 & 8) != 0) {
            __assert_fail("!pRnm->fPPi",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                          ,0x1a4,"int Rnm_ManSensitize(Rnm_Man_t *)");
          }
          if ((uVar19 & 0x9fffffff) == 0x9fffffff) {
            iVar3 = pGVar9->vCis->nSize;
            if ((int)(uVar22 & 0x1fffffff) < iVar3 - pGVar9->nRegs) goto LAB_005797b0;
            if (iVar24 != 0) {
              iVar5 = pGVar9->vCos->nSize;
              uVar22 = (iVar5 - iVar3) + (uVar22 & 0x1fffffff);
              if ((-1 < (int)uVar22) && ((int)uVar22 < iVar5)) {
                uVar22 = pGVar9->vCos->pArray[uVar22];
                lVar17 = (long)(int)uVar22;
                if ((-1 < lVar17) && (uVar22 < (uint)pGVar9->nObjs)) {
                  uVar22 = pGVar7[lVar17].Value;
                  if (uVar22 != 0 || (~*(ulong *)(pGVar7 + lVar17) & 0x1fffffff1fffffff) == 0) {
                    if ((int)uVar22 < iVar12) {
                      iVar12 = iVar12 * (iVar24 + -1);
                      RVar21 = (Rnm_Obj_t)
                               ((uint)RVar21 & 0xfffffff6 |
                               (uint)pRVar8[(long)iVar12 + (ulong)uVar22] & 1);
                      pRVar8[(long)iVar20 + (ulong)uVar2] = RVar21;
                      RVar14 = pRVar8[(long)iVar12 + (ulong)uVar22];
                      goto LAB_005799c4;
                    }
                    goto LAB_00579b72;
                  }
                  goto LAB_00579b53;
                }
                goto LAB_00579b34;
              }
              goto LAB_00579c4b;
            }
          }
          else {
LAB_005797b0:
            uVar16 = uVar10 & 0x1fffffff;
            if (uVar16 == 0x1fffffff || -1 < (int)uVar19) {
              if (((int)uVar19 < 0) || ((int)uVar16 == 0x1fffffff)) {
                __assert_fail("Gia_ObjIsAnd(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                              ,0x1b5,"int Rnm_ManSensitize(Rnm_Man_t *)");
              }
              uVar19 = pGVar1[-uVar16].Value;
              if (uVar19 == 0 && (~*(ulong *)(pGVar1 + -uVar16) & 0x1fffffff1fffffff) != 0)
              goto LAB_00579b53;
              if (iVar12 <= (int)uVar19) goto LAB_00579b72;
              uVar4 = pGVar1[-(ulong)(uVar22 & 0x1fffffff)].Value;
              if (uVar4 == 0 &&
                  (~*(ulong *)(pGVar1 + -(ulong)(uVar22 & 0x1fffffff)) & 0x1fffffff1fffffff) != 0)
              goto LAB_00579b53;
              if (iVar12 <= (int)uVar4) goto LAB_00579b72;
              uVar22 = (uVar22 >> 0x1d ^ (uint)pRVar8[(long)iVar20 + (ulong)uVar4]) &
                       ((uint)(uVar10 >> 0x1d) & 7 ^ (uint)pRVar8[(long)iVar20 + (ulong)uVar19]) & 1
              ;
              pRVar8[(long)iVar20 + (ulong)uVar2] = (Rnm_Obj_t)((uint)RVar21 & 0xfffffff6 | uVar22);
              RVar14 = pRVar8[(long)iVar20 + (ulong)uVar19];
              if (uVar22 == 0) {
                RVar6 = pRVar8[(long)iVar20 + (ulong)uVar4];
                if ((((uint)(*(ulong *)pGVar1 >> 0x1d) & 7 ^ (uint)RVar14) & 1) == 0) {
                  if ((((uint)(*(ulong *)pGVar1 >> 0x3d) ^ (uint)RVar6) & 1) != 0) {
                    uVar22 = (uint)RVar21 & 0xf0000006;
                    goto LAB_005799d1;
                  }
                  uVar19 = (uint)RVar14 >> 4 & 0xffffff;
                  uVar22 = (uint)RVar6 >> 4 & 0xffffff;
                  if (uVar19 < uVar22) {
                    uVar22 = uVar19;
                  }
                  uVar22 = uVar22 << 4;
                }
                else {
                  uVar22 = (uint)RVar6 & 0xffffff0;
                }
                RVar21 = (Rnm_Obj_t)((uint)RVar21 & 0xf0000006 | uVar22);
              }
              else {
                uVar13 = (uint)RVar14 >> 4 & 0xffffff;
                uVar19 = (uint)pRVar8[(long)iVar20 + (ulong)uVar4] >> 4 & 0xffffff;
                if (uVar19 < uVar13) {
                  uVar19 = uVar13;
                }
                RVar21 = (Rnm_Obj_t)((uint)RVar21 & 0xf0000006 | uVar22 | uVar19 << 4);
              }
            }
            else {
              uVar22 = pGVar1[-uVar16].Value;
              if (uVar22 == 0 && (~*(ulong *)(pGVar1 + -uVar16) & 0x1fffffff1fffffff) != 0)
              goto LAB_00579b53;
              if (iVar12 <= (int)uVar22) goto LAB_00579b72;
              RVar21 = (Rnm_Obj_t)
                       ((uint)RVar21 & 0xfffffff6 |
                       (uVar19 >> 0x1d ^ (uint)pRVar8[(long)iVar20 + (ulong)uVar22]) & 1);
              pRVar8[(long)iVar20 + (ulong)uVar2] = RVar21;
              RVar14 = pRVar8[(long)iVar20 + (ulong)uVar22];
LAB_005799c4:
              uVar22 = (uint)RVar21 & 0xf0000007;
LAB_005799d1:
              RVar21 = (Rnm_Obj_t)(uVar22 | (uint)RVar14 & 0xffffff0);
            }
            pRVar8[(long)iVar20 + (ulong)uVar2] = RVar21;
          }
          lVar23 = lVar23 + 1;
          pVVar15 = p->vObjs;
        } while (lVar23 < pVVar15->nSize);
      }
      pAVar18 = p->pCex;
      local_40 = local_40 + pAVar18->nPis;
      iVar12 = pAVar18->iFrame;
      bVar11 = iVar24 < iVar12;
      iVar24 = iVar24 + 1;
    } while (bVar11);
  }
  if (local_40 != pAVar18->nBits) {
    __assert_fail("iBit == p->pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                  ,0x1c3,"int Rnm_ManSensitize(Rnm_Man_t *)");
  }
  pGVar9 = p->pGia;
  iVar24 = pGVar9->vCos->nSize;
  if (iVar24 <= pGVar9->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar24 < 1) {
LAB_00579c4b:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar24 = *pGVar9->vCos->pArray;
  lVar23 = (long)iVar24;
  if ((-1 < lVar23) && (iVar24 < pGVar9->nObjs)) {
    uVar22 = pGVar9->pObjs[lVar23].Value;
    if (uVar22 != 0 || (~*(ulong *)(pGVar9->pObjs + lVar23) & 0x1fffffff1fffffff) == 0) {
      if ((int)uVar22 < p->nObjsFrame) {
        if (-1 < iVar12) {
          iVar12 = p->nObjsFrame * iVar12;
          pRVar8 = p->pObjs;
          RVar21 = pRVar8[(long)iVar12 + (ulong)uVar22];
          if (((uint)RVar21 & 1) == 0) {
            puts("Output value is incorrect.");
            RVar21 = pRVar8[(long)iVar12 + (ulong)uVar22];
          }
          return (uint)RVar21 >> 4 & 0xffffff;
        }
LAB_00579b91:
        __assert_fail("f >= 0 && f <= p->pCex->iFrame",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                      ,0x61,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
      }
LAB_00579b72:
      __assert_fail("(int)pObj->Value < p->nObjsFrame",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                    ,0x60,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
    }
LAB_00579b53:
    __assert_fail("Gia_ObjIsConst0(pObj) || pObj->Value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                  ,0x5f,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
  }
LAB_00579b34:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Rnm_ManSensitize( Rnm_Man_t * p )
{
    Rnm_Obj_t * pRnm, * pRnm0, * pRnm1;
    Gia_Obj_t * pObj;
    int f, i, iBit = p->pCex->nRegs;
    // const0 is initialized automatically in all timeframes
    for ( f = 0; f <= p->pCex->iFrame; f++, iBit += p->pCex->nPis )
    {
        Gia_ManForEachObjVec( p->vMap, p->pGia, pObj, i )
        {
            assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
            pRnm = Rnm_ManObj( p, pObj, f );
            pRnm->Value = Abc_InfoHasBit( p->pCex->pData, iBit + i );
            if ( !Gia_ObjIsPi(p->pGia, pObj) ) // this is PPI
            {
                assert( pObj->Value > 0 );
                pRnm->Prio = pObj->Value;
                pRnm->fPPi = 1;
            }
        }
        Gia_ManForEachObjVec( p->vObjs, p->pGia, pObj, i )
        {
            assert( Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) );
            pRnm = Rnm_ManObj( p, pObj, f );
            assert( !pRnm->fPPi );
            if ( Gia_ObjIsRo(p->pGia, pObj) )
            {
                if ( f == 0 )
                    continue;
                pRnm0 = Rnm_ManObj( p, Gia_ObjRoToRi(p->pGia, pObj), f-1 );
                pRnm->Value = pRnm0->Value;
                pRnm->Prio  = pRnm0->Prio;
                continue;
            }
            if ( Gia_ObjIsCo(pObj) )
            {
                pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pObj), f );
                pRnm->Value = (pRnm0->Value ^ Gia_ObjFaninC0(pObj));
                pRnm->Prio  = pRnm0->Prio;
                continue;
            }
            assert( Gia_ObjIsAnd(pObj) );
            pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pObj), f );
            pRnm1 = Rnm_ManObj( p, Gia_ObjFanin1(pObj), f );
            pRnm->Value = (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) & (pRnm1->Value ^ Gia_ObjFaninC1(pObj));
            if ( pRnm->Value == 1 )
                pRnm->Prio  = Abc_MaxInt( pRnm0->Prio, pRnm1->Prio );
            else if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRnm1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
                pRnm->Prio  = Abc_MinInt( pRnm0->Prio, pRnm1->Prio ); // choice
            else if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
                pRnm->Prio  = pRnm0->Prio;
            else 
                pRnm->Prio  = pRnm1->Prio;
        }
    }
    assert( iBit == p->pCex->nBits );
    pRnm = Rnm_ManObj( p, Gia_ManPo(p->pGia, 0), p->pCex->iFrame );
    if ( pRnm->Value != 1 )
        printf( "Output value is incorrect.\n" );
    return pRnm->Prio;
}